

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

bool diligent_spirv_cross::is_reserved_identifier
               (string *name,bool member,bool allow_reserved_prefixes)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  ulong uVar8;
  
  if (((int)CONCAT71(in_register_00000011,allow_reserved_prefixes) == 0) &&
     (bVar3 = is_reserved_prefix(name), bVar3)) {
    return true;
  }
  uVar8 = name->_M_string_length;
  if (member) {
    if (2 < uVar8) {
      uVar8 = 2;
      iVar4 = ::std::__cxx11::string::compare((ulong)name,0,(char *)0x2,0x801530);
      if (iVar4 != 0) {
        return false;
      }
      uVar7 = name->_M_string_length;
      uVar5 = uVar8;
      if (2 < uVar7) {
        uVar5 = uVar7;
      }
      for (; (uVar6 = uVar5, uVar8 < uVar7 &&
             (uVar6 = uVar8, (byte)((name->_M_dataplus)._M_p[uVar8] - 0x30U) < 10));
          uVar8 = uVar8 + 1) {
      }
      return uVar6 == uVar7;
    }
  }
  else if (((1 < uVar8) && (pcVar2 = (name->_M_dataplus)._M_p, *pcVar2 == '_')) &&
          ((byte)(pcVar2[1] - 0x30U) < 10)) {
    uVar7 = 2;
    do {
      if (uVar8 == uVar7) {
        return true;
      }
      pcVar1 = pcVar2 + uVar7;
      uVar7 = uVar7 + 1;
    } while ((byte)(*pcVar1 - 0x30U) < 10);
    return *pcVar1 == '_';
  }
  return false;
}

Assistant:

static bool is_reserved_identifier(const string &name, bool member, bool allow_reserved_prefixes)
{
	if (!allow_reserved_prefixes && is_reserved_prefix(name))
		return true;

	if (member)
	{
		// Reserved member identifiers come in one form:
		// _m[0-9]+$.
		if (name.size() < 3)
			return false;

		if (name.compare(0, 2, "_m", 2) != 0)
			return false;

		size_t index = 2;
		while (index < name.size() && is_numeric(name[index]))
			index++;

		return index == name.size();
	}
	else
	{
		// Reserved non-member identifiers come in two forms:
		// _[0-9]+$, used for temporaries which map directly to a SPIR-V ID.
		// _[0-9]+_, used for auxillary temporaries which derived from a SPIR-V ID.
		if (name.size() < 2)
			return false;

		if (name[0] != '_' || !is_numeric(name[1]))
			return false;

		size_t index = 2;
		while (index < name.size() && is_numeric(name[index]))
			index++;

		return index == name.size() || (index < name.size() && name[index] == '_');
	}
}